

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes_modes.c
# Opt level: O0

int aes_ofb_crypt(uchar *ibuf,uchar *obuf,int len,uchar *iv,aes_encrypt_ctx *ctx)

{
  int iVar1;
  uint local_54;
  uint local_4c;
  uint local_40;
  int nb;
  int b_pos;
  int cnt;
  aes_encrypt_ctx *ctx_local;
  uchar *iv_local;
  uint *puStack_20;
  int len_local;
  uchar *obuf_local;
  uchar *ibuf_local;
  
  nb = 0;
  local_40 = (uint)(ctx->inf).b[2];
  puStack_20 = (uint *)obuf;
  obuf_local = ibuf;
  if (local_40 != 0) {
    for (; (int)local_40 < 0x10 && nb < len; nb = nb + 1) {
      *(uchar *)puStack_20 = iv[(int)local_40] ^ *obuf_local;
      local_40 = local_40 + 1;
      puStack_20 = (uint *)((long)puStack_20 + 1);
      obuf_local = obuf_local + 1;
    }
    if (local_40 == 0x10) {
      local_4c = 0;
    }
    else {
      local_4c = local_40;
    }
    local_40 = local_4c;
  }
  if (len - nb >> 4 != 0) {
    if (((((ulong)obuf_local & 3) == 0) && (((ulong)puStack_20 & 3) == 0)) && (((ulong)iv & 3) == 0)
       ) {
      for (; nb + 0x10 <= len; nb = nb + 0x10) {
        if (local_40 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x31d,
                        "int aes_ofb_crypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        iVar1 = aes_encrypt(iv,iv,ctx);
        if (iVar1 != 0) {
          return 1;
        }
        *puStack_20 = *(uint *)iv ^ *(uint *)obuf_local;
        puStack_20[1] = *(uint *)(iv + 4) ^ *(uint *)(obuf_local + 4);
        puStack_20[2] = *(uint *)(iv + 8) ^ *(uint *)(obuf_local + 8);
        puStack_20[3] = *(uint *)(iv + 0xc) ^ *(uint *)(obuf_local + 0xc);
        obuf_local = obuf_local + 0x10;
        puStack_20 = puStack_20 + 4;
      }
    }
    else {
      for (; nb + 0x10 <= len; nb = nb + 0x10) {
        if (local_40 != 0) {
          __assert_fail("b_pos == 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/galkahana[P]PDF-Writer/LibAesgm/aes_modes.c"
                        ,0x32c,
                        "int aes_ofb_crypt(const unsigned char *, unsigned char *, int, unsigned char *, aes_encrypt_ctx *)"
                       );
        }
        iVar1 = aes_encrypt(iv,iv,ctx);
        if (iVar1 != 0) {
          return 1;
        }
        *(uchar *)puStack_20 = *iv ^ *obuf_local;
        *(uchar *)((long)puStack_20 + 1) = iv[1] ^ obuf_local[1];
        *(uchar *)((long)puStack_20 + 2) = iv[2] ^ obuf_local[2];
        *(uchar *)((long)puStack_20 + 3) = iv[3] ^ obuf_local[3];
        *(uchar *)(puStack_20 + 1) = iv[4] ^ obuf_local[4];
        *(uchar *)((long)puStack_20 + 5) = iv[5] ^ obuf_local[5];
        *(uchar *)((long)puStack_20 + 6) = iv[6] ^ obuf_local[6];
        *(uchar *)((long)puStack_20 + 7) = iv[7] ^ obuf_local[7];
        *(uchar *)(puStack_20 + 2) = iv[8] ^ obuf_local[8];
        *(uchar *)((long)puStack_20 + 9) = iv[9] ^ obuf_local[9];
        *(uchar *)((long)puStack_20 + 10) = iv[10] ^ obuf_local[10];
        *(uchar *)((long)puStack_20 + 0xb) = iv[0xb] ^ obuf_local[0xb];
        *(uchar *)(puStack_20 + 3) = iv[0xc] ^ obuf_local[0xc];
        *(uchar *)((long)puStack_20 + 0xd) = iv[0xd] ^ obuf_local[0xd];
        *(uchar *)((long)puStack_20 + 0xe) = iv[0xe] ^ obuf_local[0xe];
        *(uchar *)((long)puStack_20 + 0xf) = iv[0xf] ^ obuf_local[0xf];
        obuf_local = obuf_local + 0x10;
        puStack_20 = puStack_20 + 4;
      }
    }
  }
  while( true ) {
    if (len <= nb) {
      (ctx->inf).b[2] = (uint8_t)local_40;
      return 0;
    }
    if ((local_40 == 0) && (iVar1 = aes_encrypt(iv,iv,ctx), iVar1 != 0)) break;
    for (; nb < len && (int)local_40 < 0x10; nb = nb + 1) {
      *(uchar *)puStack_20 = iv[(int)local_40] ^ *obuf_local;
      local_40 = local_40 + 1;
      puStack_20 = (uint *)((long)puStack_20 + 1);
      obuf_local = obuf_local + 1;
    }
    if (local_40 == 0x10) {
      local_54 = 0;
    }
    else {
      local_54 = local_40;
    }
    local_40 = local_54;
  }
  return 1;
}

Assistant:

AES_RETURN aes_ofb_crypt(const unsigned char *ibuf, unsigned char *obuf,
                    int len, unsigned char *iv, aes_encrypt_ctx ctx[1])
{   int cnt = 0, b_pos = (int)ctx->inf.b[2], nb;

    if(b_pos)           /* complete any partial block   */
    {
        while(b_pos < AES_BLOCK_SIZE && cnt < len)
        {
            *obuf++ = iv[b_pos++] ^ *ibuf++;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    if((nb = (len - cnt) >> 4) != 0)   /* process whole blocks */
    {
#if defined( USE_VIA_ACE_IF_PRESENT )

        if(ctx->inf.b[1] == 0xff)
        {   int m;
            uint8_t *ksp = (uint8_t*)(ctx->ks), *ivp = iv;
            aligned_auto(uint8_t, liv, AES_BLOCK_SIZE, 16);
            via_cwd(cwd, hybrid, enc, 2 * ctx->inf.b[0] - 192);

            if(ALIGN_OFFSET( ctx, 16 ))
                return EXIT_FAILURE;

            if(ALIGN_OFFSET( iv, 16 ))   /* ensure an aligned iv */
            {
                ivp = liv;
                memcpy(liv, iv, AES_BLOCK_SIZE);
            }

            if(!ALIGN_OFFSET( ibuf, 16 ) && !ALIGN_OFFSET( obuf, 16 ))
            {
                via_ofb_op6(ksp, cwd, ibuf, obuf, nb, ivp);
                ibuf += nb * AES_BLOCK_SIZE;
                obuf += nb * AES_BLOCK_SIZE;
                cnt  += nb * AES_BLOCK_SIZE;
            }
            else    /* input, output or both are unaligned  */
        {   aligned_auto(uint8_t, buf, BFR_BLOCKS * AES_BLOCK_SIZE, 16);
            uint8_t *ip, *op;

                while(nb)
                {
                    m = (nb > BFR_BLOCKS ? BFR_BLOCKS : nb), nb -= m;

                    ip = (ALIGN_OFFSET( ibuf, 16 ) ? buf : ibuf);
                    op = (ALIGN_OFFSET( obuf, 16 ) ? buf : obuf);

                    if(ip != ibuf)
                        memcpy(buf, ibuf, m * AES_BLOCK_SIZE);

                    via_ofb_op6(ksp, cwd, ip, op, m, ivp);

                    if(op != obuf)
                        memcpy(obuf, buf, m * AES_BLOCK_SIZE);

                    ibuf += m * AES_BLOCK_SIZE;
                    obuf += m * AES_BLOCK_SIZE;
                    cnt  += m * AES_BLOCK_SIZE;
                }
            }

            if(ivp != iv)
                memcpy(iv, ivp, AES_BLOCK_SIZE);
        }
#else
# ifdef FAST_BUFFER_OPERATIONS
        if(!ALIGN_OFFSET( ibuf, 4 ) && !ALIGN_OFFSET( obuf, 4 ) && !ALIGN_OFFSET( iv, 4 ))
            while(cnt + AES_BLOCK_SIZE <= len)
            {
                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                lp32(obuf)[0] = lp32(iv)[0] ^ lp32(ibuf)[0];
                lp32(obuf)[1] = lp32(iv)[1] ^ lp32(ibuf)[1];
                lp32(obuf)[2] = lp32(iv)[2] ^ lp32(ibuf)[2];
                lp32(obuf)[3] = lp32(iv)[3] ^ lp32(ibuf)[3];
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
        else
# endif
            while(cnt + AES_BLOCK_SIZE <= len)
            {
                assert(b_pos == 0);
                if(aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
                    return EXIT_FAILURE;
                obuf[ 0] = iv[ 0] ^ ibuf[ 0]; obuf[ 1] = iv[ 1] ^ ibuf[ 1];
                obuf[ 2] = iv[ 2] ^ ibuf[ 2]; obuf[ 3] = iv[ 3] ^ ibuf[ 3];
                obuf[ 4] = iv[ 4] ^ ibuf[ 4]; obuf[ 5] = iv[ 5] ^ ibuf[ 5];
                obuf[ 6] = iv[ 6] ^ ibuf[ 6]; obuf[ 7] = iv[ 7] ^ ibuf[ 7];
                obuf[ 8] = iv[ 8] ^ ibuf[ 8]; obuf[ 9] = iv[ 9] ^ ibuf[ 9];
                obuf[10] = iv[10] ^ ibuf[10]; obuf[11] = iv[11] ^ ibuf[11];
                obuf[12] = iv[12] ^ ibuf[12]; obuf[13] = iv[13] ^ ibuf[13];
                obuf[14] = iv[14] ^ ibuf[14]; obuf[15] = iv[15] ^ ibuf[15];
                ibuf += AES_BLOCK_SIZE;
                obuf += AES_BLOCK_SIZE;
                cnt  += AES_BLOCK_SIZE;
            }
#endif
    }

    while(cnt < len)
    {
        if(!b_pos && aes_encrypt(iv, iv, ctx) != EXIT_SUCCESS)
            return EXIT_FAILURE;

        while(cnt < len && b_pos < AES_BLOCK_SIZE)
        {
            *obuf++ = iv[b_pos++] ^ *ibuf++;
            cnt++;
        }

        b_pos = (b_pos == AES_BLOCK_SIZE ? 0 : b_pos);
    }

    ctx->inf.b[2] = (uint8_t)b_pos;
    return EXIT_SUCCESS;
}